

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_mp_rshift_safe(void)

{
  _func_size_t_size_t *p_Var1;
  mp_int *x;
  size_t sVar2;
  mp_int *x_00;
  size_t i;
  ulong bits;
  
  x = mp_random_bits_fn(0x100,random_read);
  bits = 0;
  while( true ) {
    p_Var1 = looplimit;
    sVar2 = mp_max_bits(x);
    sVar2 = (*p_Var1)(sVar2 + 1);
    if (sVar2 <= bits) break;
    log_start();
    x_00 = mp_rshift_safe(x,bits);
    log_end();
    mp_free(x_00);
    bits = bits + 1;
  }
  mp_free(x);
  return;
}

Assistant:

static void test_mp_rshift_safe(void)
{
    mp_int *x = mp_random_bits(256);

    for (size_t i = 0; i < looplimit(mp_max_bits(x)+1); i++) {
        log_start();
        mp_int *r = mp_rshift_safe(x, i);
        log_end();
        mp_free(r);
    }

    mp_free(x);
}